

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj4fio.h
# Opt level: O3

ssize_t fiobj_send_free(intptr_t uuid,FIOBJ o)

{
  fio_write_args_s options;
  ssize_t sVar1;
  fiobj_object_vtable_s *pfVar2;
  uint uVar3;
  char cVar4;
  fio_str_info_s s;
  fio_str_info_s local_58;
  FIOBJ local_38;
  code *pcStack_30;
  undefined8 local_28;
  long lStack_20;
  undefined1 local_18;
  uint7 uStack_17;
  
  if (o == 0) {
LAB_00151470:
    local_58.data = anon_var_dwarf_20c;
    local_58.len._0_4_ = 4;
    goto LAB_00151483;
  }
  cVar4 = (char)o;
  if ((o & 1) != 0) {
    fio_ltocstr(&local_58,(long)o >> 1);
    goto LAB_00151488;
  }
  switch((uint)o & 6) {
  case 0:
    cVar4 = *(char *)(o & 0xfffffffffffffff8);
LAB_001513fe:
    switch(cVar4) {
    case '\'':
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_001513f3_caseD_2;
    case ')':
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_001513f3_caseD_4;
    case '+':
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_001513f3_caseD_2:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_001513f3_caseD_4:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar4 == '&') {
      local_58.data = anon_var_dwarf_217;
      local_58.len._0_4_ = 5;
    }
    else {
      uVar3 = (uint)o & 0xff;
      if (uVar3 != 0x16) {
        if (uVar3 == 6) goto LAB_00151470;
        goto LAB_001513fe;
      }
      local_58.data = anon_var_dwarf_222;
      local_58.len._0_4_ = 4;
    }
LAB_00151483:
    local_58.capa._0_4_ = 0;
    local_58.capa._4_4_ = 0;
    local_58.len._4_4_ = 0;
    goto LAB_00151488;
  }
  (*pfVar2->to_str)(&local_58,o);
LAB_00151488:
  pcStack_30 = fiobj4sock_dealloc;
  local_28 = CONCAT44(local_58.len._4_4_,(undefined4)local_58.len);
  lStack_20 = (long)local_58.data - o;
  local_18 = 0;
  options.after.dealloc = fiobj4sock_dealloc;
  options.data.fd = o;
  options.length = local_28;
  options.offset = lStack_20;
  options._32_8_ = (ulong)uStack_17 << 8;
  local_38 = o;
  sVar1 = fio_write2_fn(uuid,options);
  return sVar1;
}

Assistant:

static inline __attribute__((unused)) ssize_t fiobj_send_free(intptr_t uuid,
                                                              FIOBJ o) {
  fio_str_info_s s = fiobj_obj2cstr(o);
  return fio_write2(uuid, .data.buffer = (void *)(o),
                    .offset = (uintptr_t)(((intptr_t)s.data) - ((intptr_t)(o))),
                    .length = s.len, .after.dealloc = fiobj4sock_dealloc);
}